

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

size_t Catch::listTags(Config *config)

{
  size_t sVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  TestSpecParser *this;
  vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> *testCases;
  pointer pTVar3;
  iterator iVar4;
  _Rb_tree_node_base *p_Var5;
  ostream *poVar6;
  _Base_ptr p_Var7;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagInfo>_>,_bool>
  pVar8;
  string lcaseTagName;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagInfo>_>_>
  tagCounts;
  string tagName;
  vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> matchedTestCases;
  TestSpec testSpec;
  Text wrapper;
  ostringstream oss;
  undefined1 local_2c0 [32];
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagInfo>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagInfo>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagInfo>_>_>
  local_2a0;
  string local_270;
  vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> local_250;
  TestSpec local_238;
  Text local_220;
  string local_1c8 [8];
  size_type local_1c0;
  undefined1 local_1a8 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_190;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_180;
  _Base_ptr local_170;
  _Base_ptr p_Stack_168;
  pointer local_160;
  pointer pFStack_158;
  pointer local_150;
  pointer pFStack_148;
  TagAliasRegistry *local_140;
  
  iVar2 = (*(config->super_SharedImpl<Catch::IConfig>).super_IConfig.super_IShared.super_NonCopyable
            ._vptr_NonCopyable[0xd])();
  std::vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>::vector
            (&local_238.m_filters,
             (vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_> *)
             CONCAT44(extraout_var,iVar2));
  iVar2 = (*(config->super_SharedImpl<Catch::IConfig>).super_IConfig.super_IShared.super_NonCopyable
            ._vptr_NonCopyable[0xd])(config);
  if (*(long *)CONCAT44(extraout_var_00,iVar2) == ((long *)CONCAT44(extraout_var_00,iVar2))[1]) {
    std::operator<<((ostream *)&std::cout,"All available tags:\n");
    TagAliasRegistry::get();
    local_190._M_allocated_capacity = (size_type)&local_180;
    local_190._8_8_ = 0;
    local_180._M_local_buf[0] = '\0';
    local_170 = (_Base_ptr)0x0;
    p_Stack_168 = (_Base_ptr)0x0;
    local_160 = (pointer)0x0;
    pFStack_158 = (pointer)0x0;
    local_150 = (pointer)0x0;
    pFStack_148 = (pointer)0x0;
    local_140 = &TagAliasRegistry::get::instance;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_220,"*",(allocator<char> *)&local_270);
    this = TestSpecParser::parse((TestSpecParser *)local_1a8,&local_220.str);
    TestSpecParser::testSpec((TestSpec *)&local_2a0,this);
    std::vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>::_M_move_assign
              (&local_238.m_filters,&local_2a0);
    std::vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>::~vector
              ((vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_> *)
               &local_2a0);
    std::__cxx11::string::~string((string *)&local_220);
    TestSpecParser::~TestSpecParser((TestSpecParser *)local_1a8);
  }
  else {
    std::operator<<((ostream *)&std::cout,"Tags for matching test cases:\n");
  }
  local_2a0._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_2a0._M_impl.super__Rb_tree_header._M_header;
  local_2a0._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_2a0._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_2a0._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_2a0._M_impl.super__Rb_tree_header._M_header._M_right =
       local_2a0._M_impl.super__Rb_tree_header._M_header._M_left;
  testCases = getAllTestCasesSorted((IConfig *)config);
  filterTests(&local_250,testCases,&local_238,(IConfig *)config);
  for (pTVar3 = local_250.super__Vector_base<Catch::TestCase,_std::allocator<Catch::TestCase>_>.
                _M_impl.super__Vector_impl_data._M_start;
      pTVar3 != local_250.super__Vector_base<Catch::TestCase,_std::allocator<Catch::TestCase>_>.
                _M_impl.super__Vector_impl_data._M_finish; pTVar3 = pTVar3 + 1) {
    for (p_Var5 = (pTVar3->super_TestCaseInfo).tags._M_t._M_impl.super__Rb_tree_header._M_header.
                  _M_left;
        (_Rb_tree_header *)p_Var5 !=
        &(pTVar3->super_TestCaseInfo).tags._M_t._M_impl.super__Rb_tree_header;
        p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5)) {
      std::__cxx11::string::string((string *)&local_270,(string *)(p_Var5 + 1));
      toLower((string *)local_2c0,&local_270);
      iVar4 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagInfo>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagInfo>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagInfo>_>_>
              ::find(&local_2a0,(string *)local_2c0);
      if ((_Rb_tree_header *)iVar4._M_node == &local_2a0._M_impl.super__Rb_tree_header) {
        local_220.str._M_string_length._0_4_ = 0;
        local_220.str.field_2._M_allocated_capacity = 0;
        local_220.str.field_2._8_8_ = &local_220.str._M_string_length;
        local_220.attr.indent = 0;
        local_220.attr.width = 0;
        local_220.attr.initialIndent = local_220.str.field_2._8_8_;
        std::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagInfo>
        ::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_Catch::TagInfo,_true>
                  ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagInfo>
                    *)local_1a8,(string *)local_2c0,(TagInfo *)&local_220);
        pVar8 = std::
                _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,Catch::TagInfo>,std::_Select1st<std::pair<std::__cxx11::string_const,Catch::TagInfo>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,Catch::TagInfo>>>
                ::_M_emplace_unique<std::pair<std::__cxx11::string,Catch::TagInfo>>
                          ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,Catch::TagInfo>,std::_Select1st<std::pair<std::__cxx11::string_const,Catch::TagInfo>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,Catch::TagInfo>>>
                            *)&local_2a0,
                           (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagInfo>
                            *)local_1a8);
        iVar4._M_node = (_Base_ptr)pVar8.first._M_node;
        std::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagInfo>
        ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagInfo>
                 *)local_1a8);
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&local_220);
      }
      TagInfo::add((TagInfo *)(iVar4._M_node + 2),&local_270);
      std::__cxx11::string::~string((string *)local_2c0);
      std::__cxx11::string::~string((string *)&local_270);
    }
  }
  for (p_Var7 = local_2a0._M_impl.super__Rb_tree_header._M_header._M_left;
      sVar1 = local_2a0._M_impl.super__Rb_tree_header._M_node_count,
      (_Rb_tree_header *)p_Var7 != &local_2a0._M_impl.super__Rb_tree_header;
      p_Var7 = (_Base_ptr)std::_Rb_tree_increment(p_Var7)) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    poVar6 = std::operator<<((ostream *)local_1a8,"  ");
    *(undefined8 *)(poVar6 + *(long *)(*(long *)poVar6 + -0x18) + 0x10) = 2;
    poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
    std::operator<<(poVar6,"  ");
    TagInfo::all_abi_cxx11_(&local_270,(TagInfo *)(p_Var7 + 2));
    local_2c0._16_8_ = 0x4f;
    local_2c0[0x18] = '\t';
    local_2c0._0_8_ = (pointer)0x0;
    local_2c0._8_8_ = 0;
    std::__cxx11::stringbuf::str();
    local_2c0._8_8_ = local_1c0;
    local_2c0._16_8_ = 0x46;
    Tbc::Text::Text(&local_220,&local_270,(TextAttributes *)local_2c0);
    std::__cxx11::string::~string(local_1c8);
    std::__cxx11::string::~string((string *)&local_270);
    std::__cxx11::stringbuf::str();
    poVar6 = std::operator<<((ostream *)&std::cout,(string *)&local_270);
    poVar6 = Tbc::operator<<(poVar6,&local_220);
    std::operator<<(poVar6,"\n");
    std::__cxx11::string::~string((string *)&local_270);
    Tbc::Text::~Text(&local_220);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_220,"tag",(allocator<char> *)&local_270);
  local_1a8._0_8_ = sVar1;
  std::__cxx11::string::string((string *)(local_1a8 + 8),(string *)&local_220);
  operator<<((ostream *)&std::cout,(pluralise *)local_1a8);
  poVar6 = std::operator<<((ostream *)&std::cout,"\n");
  std::endl<char,std::char_traits<char>>(poVar6);
  std::__cxx11::string::~string((string *)(local_1a8 + 8));
  std::__cxx11::string::~string((string *)&local_220);
  sVar1 = local_2a0._M_impl.super__Rb_tree_header._M_node_count;
  std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>::~vector(&local_250);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagInfo>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagInfo>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagInfo>_>_>
  ::~_Rb_tree(&local_2a0);
  std::vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>::~vector
            (&local_238.m_filters);
  return (size_t)(pointer)sVar1;
}

Assistant:

inline std::size_t listTags( Config const& config ) {
        TestSpec testSpec = config.testSpec();
        if( config.testSpec().hasFilters() )
            Catch::cout() << "Tags for matching test cases:\n";
        else {
            Catch::cout() << "All available tags:\n";
            testSpec = TestSpecParser( ITagAliasRegistry::get() ).parse( "*" ).testSpec();
        }

        std::map<std::string, TagInfo> tagCounts;

        std::vector<TestCase> matchedTestCases = filterTests( getAllTestCasesSorted( config ), testSpec, config );
        for( std::vector<TestCase>::const_iterator it = matchedTestCases.begin(), itEnd = matchedTestCases.end();
                it != itEnd;
                ++it ) {
            for( std::set<std::string>::const_iterator  tagIt = it->getTestCaseInfo().tags.begin(),
                                                        tagItEnd = it->getTestCaseInfo().tags.end();
                    tagIt != tagItEnd;
                    ++tagIt ) {
                std::string tagName = *tagIt;
                std::string lcaseTagName = toLower( tagName );
                std::map<std::string, TagInfo>::iterator countIt = tagCounts.find( lcaseTagName );
                if( countIt == tagCounts.end() )
                    countIt = tagCounts.insert( std::make_pair( lcaseTagName, TagInfo() ) ).first;
                countIt->second.add( tagName );
            }
        }

        for( std::map<std::string, TagInfo>::const_iterator countIt = tagCounts.begin(),
                                                            countItEnd = tagCounts.end();
                countIt != countItEnd;
                ++countIt ) {
            std::ostringstream oss;
            oss << "  " << std::setw(2) << countIt->second.count << "  ";
            Text wrapper( countIt->second.all(), TextAttributes()
                                                    .setInitialIndent( 0 )
                                                    .setIndent( oss.str().size() )
                                                    .setWidth( CATCH_CONFIG_CONSOLE_WIDTH-10 ) );
            Catch::cout() << oss.str() << wrapper << "\n";
        }
        Catch::cout() << pluralise( tagCounts.size(), "tag" ) << "\n" << std::endl;
        return tagCounts.size();
    }